

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_save_simple_key(yaml_parser_t *parser)

{
  size_t sVar1;
  yaml_token_t *pyVar2;
  yaml_token_t *pyVar3;
  size_t sVar4;
  yaml_simple_key_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  
  uVar9 = 0;
  if (parser->flow_level == 0) {
    uVar9 = (uint)((parser->mark).column == (long)parser->indent);
  }
  iVar8 = 1;
  if (parser->simple_key_allowed != 0) {
    sVar1 = parser->tokens_parsed;
    pyVar2 = (parser->tokens).tail;
    pyVar3 = (parser->tokens).head;
    sVar4 = (parser->mark).column;
    sVar6 = (parser->mark).index;
    sVar7 = (parser->mark).line;
    pyVar5 = (parser->simple_keys).top;
    if ((pyVar5[-1].possible == 0) || (pyVar5[-1].required == 0)) {
      pyVar5[-1].possible = 1;
      pyVar5[-1].required = uVar9;
      pyVar5[-1].token_number = ((long)pyVar2 - (long)pyVar3 >> 4) * -0x3333333333333333 + sVar1;
      pyVar5[-1].mark.index = sVar6;
      pyVar5[-1].mark.line = sVar7;
      pyVar5[-1].mark.column = sVar4;
      return iVar8;
    }
    sVar1 = pyVar5[-1].mark.column;
    sVar4 = pyVar5[-1].mark.index;
    sVar6 = pyVar5[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    (parser->context_mark).index = sVar4;
    (parser->context_mark).line = sVar6;
    (parser->context_mark).column = sVar1;
    parser->problem = "could not find expected \':\'";
    sVar1 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar1;
    (parser->problem_mark).column = (parser->mark).column;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int
yaml_parser_save_simple_key(yaml_parser_t *parser)
{
    /*
     * A simple key is required at the current position if the scanner is in
     * the block context and the current column coincides with the indentation
     * level.
     */

    int required = (!parser->flow_level
            && parser->indent == (ptrdiff_t)parser->mark.column);

    /*
     * If the current position may start a simple key, save it.
     */

    if (parser->simple_key_allowed)
    {
        yaml_simple_key_t simple_key;
        simple_key.possible = 1;
        simple_key.required = required;
        simple_key.token_number =
            parser->tokens_parsed + (parser->tokens.tail - parser->tokens.head);
        simple_key.mark = parser->mark;

        if (!yaml_parser_remove_simple_key(parser)) return 0;

        *(parser->simple_keys.top-1) = simple_key;
    }

    return 1;
}